

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ghosts.c
# Opt level: O3

logical pnga_update3_ghosts(Integer g_a)

{
  long lVar1;
  short sVar2;
  ushort uVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  char **ppcVar7;
  char *pcVar8;
  char *pcVar9;
  C_Integer *pCVar10;
  global_array_t *pgVar11;
  int _d;
  int iVar12;
  Integer proc;
  logical lVar13;
  long grp_id;
  Integer *map;
  ulong *proclist;
  long lVar14;
  size_t sVar15;
  Integer IVar16;
  ulong uVar17;
  int iVar18;
  logical lVar19;
  long lVar20;
  long lVar21;
  int iVar22;
  long lVar23;
  long lVar24;
  C_Integer CVar25;
  Integer _last;
  long lVar26;
  long lVar27;
  ulong uVar28;
  long lVar29;
  long lVar30;
  int _ndim_4;
  ulong uVar31;
  long ndim;
  ulong uVar32;
  long lVar33;
  Integer IVar34;
  int _ndim;
  int local_618;
  int _index [7];
  Integer _hi [7];
  int count [7];
  int stride_rem [7];
  int stride_loc [7];
  Integer np;
  Integer plo_rem [7];
  char err_string [256];
  Integer plo_loc [7];
  Integer phi_rem [7];
  Integer tlo_rem [7];
  Integer thi_rem [7];
  Integer ld_rem [7];
  Integer ld_loc [7];
  Integer shi_rem [7];
  Integer slo_rem [7];
  Integer width [7];
  Integer hi_loc [7];
  Integer lo_loc [7];
  Integer increment [7];
  Integer dims [7];
  
  proc = pnga_nodeid();
  lVar13 = pnga_has_ghosts(g_a);
  lVar19 = 1;
  if (lVar13 != 0) {
    lVar1 = g_a + 1000;
    iVar4 = GA[lVar1].elemsize;
    sVar2 = GA[lVar1].ndim;
    ndim = (long)sVar2;
    iVar5 = GA[lVar1].p_handle;
    grp_id = (long)iVar5;
    pnga_distribution(g_a,proc,lo_loc,hi_loc);
    if (0 < ndim) {
      lVar20 = 0;
      do {
        increment[lVar20] = 0;
        width[lVar20] = GA[g_a + 1000].width[lVar20];
        dims[lVar20] = GA[g_a + 1000].dims[lVar20];
        if ((lo_loc[lVar20] == 0) && (hi_loc[lVar20] == -1)) goto LAB_0018b2b6;
        lVar20 = lVar20 + 1;
      } while (ndim != lVar20);
    }
    lVar13 = gai_check_ghost_distr(g_a);
    IVar34 = GAnproc;
    if (lVar13 == 0) {
LAB_0018b2b6:
      lVar19 = 0;
    }
    else {
      map = (Integer *)malloc(GAnproc * 0x70 | 8);
      if (map == (Integer *)0x0) {
        pnga_error("pnga_update3_ghosts:malloc failed (_ga_map)",0);
        IVar34 = GAnproc;
      }
      proclist = (ulong *)malloc(IVar34 << 3);
      if (proclist == (ulong *)0x0) {
        pnga_error("pnga_update3_ghosts:malloc failed (_ga_proclist)",0);
      }
      if (0 < sVar2) {
        local_618 = (int)proc;
        lVar14 = (long)local_618;
        lVar20 = ndim + -1;
        lVar21 = 1;
        if (1 < lVar20) {
          lVar21 = lVar20;
        }
        IVar34 = 0;
        do {
          lVar6 = width[IVar34];
          if (lVar6 != 0) {
            get_remote_block_neg(IVar34,ndim,lo_loc,hi_loc,slo_rem,shi_rem,dims,width);
            lVar13 = pnga_locate_region(g_a,slo_rem,shi_rem,map,(Integer *)proclist,&np);
            if (lVar13 == 0) {
              builtin_strncpy(err_string,"cannot locate region: ",0x17);
              strcpy(err_string + 0x16,GA[lVar1].name);
              sVar15 = strlen(err_string);
              sprintf(err_string + (int)sVar15," [%ld:%ld ",slo_rem[0],shi_rem[0]);
              sVar15 = strlen(err_string);
              iVar18 = (int)sVar15;
              IVar16 = pnga_ndim(g_a);
              if (1 < IVar16) {
                lVar33 = 1;
                do {
                  sprintf(err_string + (int)sVar15,",%ld:%ld ",slo_rem[lVar33],shi_rem[lVar33]);
                  sVar15 = strlen(err_string);
                  iVar18 = (int)sVar15;
                  lVar33 = lVar33 + 1;
                  IVar16 = pnga_ndim(g_a);
                } while (lVar33 < IVar16);
              }
              (err_string + iVar18)[0] = ']';
              (err_string + iVar18)[1] = '\0';
              pnga_error(err_string,g_a);
            }
            uVar32 = *proclist;
            pnga_distribution(g_a,uVar32,tlo_rem,thi_rem);
            pgVar11 = GA;
            lVar33 = 0;
            do {
              if (increment[lVar33] == 0) {
                if (IVar34 == lVar33) {
                  plo_rem[IVar34] = lVar6 + 1 + (thi_rem[IVar34] - tlo_rem[IVar34]);
                  phi_rem[IVar34] = (thi_rem[IVar34] - tlo_rem[IVar34]) + lVar6 * 2;
                  plo_loc[IVar34] = lVar6;
                }
                else {
                  lVar23 = width[lVar33];
                  plo_rem[lVar33] = lVar23;
                  phi_rem[lVar33] = (thi_rem[lVar33] + lVar23) - tlo_rem[lVar33];
                  plo_loc[lVar33] = lVar23;
                }
              }
              else {
                plo_rem[lVar33] = 0;
                phi_rem[lVar33] = (increment[lVar33] + thi_rem[lVar33]) - tlo_rem[lVar33];
                plo_loc[lVar33] = 0;
              }
              lVar33 = lVar33 + 1;
            } while (ndim != lVar33);
            uVar3 = GA[lVar1].ndim;
            uVar31 = (ulong)(short)uVar3;
            iVar18 = GA[lVar1].distr_type;
            if (iVar18 - 1U < 3) {
              lVar33 = GA[lVar1].num_blocks[0];
              lVar23 = lVar14 % lVar33;
              _index[0] = (int)lVar23;
              if (1 < (short)uVar3) {
                lVar29 = 0;
                IVar16 = proc;
                do {
                  IVar16 = (long)((int)IVar16 - (int)lVar23) / lVar33;
                  lVar33 = GA[g_a + 1000].num_blocks[lVar29 + 1];
                  lVar23 = (long)(int)IVar16 % lVar33;
                  _index[lVar29 + 1] = (int)lVar23;
                  lVar29 = lVar29 + 1;
                } while ((uVar31 & 0xffffffff) - 1 != lVar29);
              }
              if (0 < (short)uVar3) {
                lVar33 = 0;
                do {
                  iVar22 = *(int *)((long)_index + lVar33);
                  lVar23 = *(long *)((long)GA[g_a + 1000].block_dims + lVar33 * 2);
                  *(long *)(err_string + lVar33 * 2) = lVar23 * iVar22 + 1;
                  lVar23 = ((long)iVar22 + 1) * lVar23;
                  lVar29 = *(long *)((long)GA[g_a + 1000].dims + lVar33 * 2);
                  if (lVar29 <= lVar23) {
                    lVar23 = lVar29;
                  }
                  *(long *)((long)_hi + lVar33 * 2) = lVar23;
                  lVar33 = lVar33 + 4;
                } while ((uVar31 & 0xffffffff) << 2 != lVar33);
              }
            }
            else if (iVar18 == 4) {
              lVar33 = GA[lVar1].num_blocks[0];
              lVar23 = lVar14 % lVar33;
              _index[0] = (int)lVar23;
              if (1 < (short)uVar3) {
                lVar29 = 0;
                IVar16 = proc;
                do {
                  IVar16 = (long)((int)IVar16 - (int)lVar23) / lVar33;
                  lVar33 = GA[g_a + 1000].num_blocks[lVar29 + 1];
                  lVar23 = (long)(int)IVar16 % lVar33;
                  _index[lVar29 + 1] = (int)lVar23;
                  lVar29 = lVar29 + 1;
                } while ((uVar31 & 0xffffffff) - 1 != lVar29);
              }
              if (0 < (short)uVar3) {
                pCVar10 = GA[lVar1].mapc;
                lVar33 = 0;
                iVar22 = 0;
                do {
                  iVar12 = *(int *)((long)_index + lVar33);
                  lVar29 = (long)iVar22 + (long)iVar12;
                  *(C_Integer *)(err_string + lVar33 * 2) = pCVar10[lVar29];
                  lVar23 = *(long *)((long)GA[lVar1].num_blocks + lVar33 * 2);
                  if ((long)iVar12 < lVar23 + -1) {
                    lVar29 = pCVar10[lVar29 + 1] + -1;
                  }
                  else {
                    lVar29 = *(long *)((long)GA[lVar1].dims + lVar33 * 2);
                  }
                  *(long *)((long)_hi + lVar33 * 2) = lVar29;
                  iVar22 = iVar22 + (int)lVar23;
                  lVar33 = lVar33 + 4;
                } while ((uVar31 & 0xffffffff) << 2 != lVar33);
              }
            }
            else if (iVar18 == 0) {
              if (GA[lVar1].num_rstrctd == 0) {
                if (0 < (short)uVar3) {
                  lVar33 = 1;
                  uVar17 = 0;
                  do {
                    lVar33 = lVar33 * GA[g_a + 1000].nblock[uVar17];
                    uVar17 = uVar17 + 1;
                  } while (uVar31 != uVar17);
                  if ((proc < 0) || (lVar33 <= proc)) goto LAB_0018a099;
                  if (0 < (short)uVar3) {
                    pCVar10 = GA[lVar1].mapc;
                    uVar17 = 0;
                    lVar33 = 0;
                    IVar16 = proc;
                    do {
                      lVar29 = (long)GA[g_a + 1000].nblock[uVar17];
                      lVar23 = IVar16 % lVar29;
                      plo_loc[uVar17 - 0x20] = pCVar10[lVar23 + lVar33];
                      if (lVar23 == lVar29 + -1) {
                        CVar25 = GA[g_a + 1000].dims[uVar17];
                      }
                      else {
                        CVar25 = pCVar10[lVar23 + lVar33 + 1] + -1;
                      }
                      lVar33 = lVar33 + lVar29;
                      _hi[uVar17] = CVar25;
                      uVar17 = uVar17 + 1;
                      IVar16 = IVar16 / lVar29;
                    } while (uVar31 != uVar17);
                  }
                }
              }
              else if (proc < GA[lVar1].num_rstrctd) {
                if (0 < (short)uVar3) {
                  lVar33 = 1;
                  uVar17 = 0;
                  do {
                    lVar33 = lVar33 * GA[g_a + 1000].nblock[uVar17];
                    uVar17 = uVar17 + 1;
                  } while (uVar31 != uVar17);
                  if ((proc < 0) || (lVar33 <= proc)) goto LAB_0018a099;
                  if (0 < (short)uVar3) {
                    pCVar10 = GA[lVar1].mapc;
                    uVar17 = 0;
                    lVar33 = 0;
                    IVar16 = proc;
                    do {
                      lVar29 = (long)GA[g_a + 1000].nblock[uVar17];
                      lVar23 = IVar16 % lVar29;
                      plo_loc[uVar17 - 0x20] = pCVar10[lVar23 + lVar33];
                      if (lVar23 == lVar29 + -1) {
                        CVar25 = GA[g_a + 1000].dims[uVar17];
                      }
                      else {
                        CVar25 = pCVar10[lVar23 + lVar33 + 1] + -1;
                      }
                      lVar33 = lVar33 + lVar29;
                      _hi[uVar17] = CVar25;
                      uVar17 = uVar17 + 1;
                      IVar16 = IVar16 / lVar29;
                    } while (uVar31 != uVar17);
                  }
                }
              }
              else {
LAB_0018a099:
                if (0 < (short)uVar3) {
                  memset(err_string,0,uVar31 * 8);
                  memset(_hi,0xff,uVar31 * 8);
                }
              }
            }
            if (uVar31 == 1) {
              ld_loc[0] = (_hi[0] - err_string._0_8_) + pgVar11[lVar1].width[0] * 2 + 1;
            }
            if ((short)uVar3 < 2) {
              lVar23 = 1;
              lVar33 = 0;
            }
            else {
              lVar23 = 1;
              lVar29 = 0;
              lVar33 = 0;
              do {
                lVar33 = lVar33 + plo_loc[lVar29] * lVar23;
                lVar26 = (_hi[lVar29] - plo_loc[lVar29 + -0x20]) +
                         pgVar11[g_a + 1000].width[lVar29] * 2 + 1;
                ld_loc[lVar29] = lVar26;
                lVar23 = lVar23 * lVar26;
                lVar29 = lVar29 + 1;
              } while (uVar31 - 1 != lVar29);
            }
            lVar29 = plo_loc[uVar31 - 1];
            ppcVar7 = pgVar11[lVar1].ptr;
            iVar22 = pgVar11[lVar1].elemsize;
            pcVar8 = ppcVar7[proc];
            if (iVar18 - 1U < 3) {
              lVar26 = pgVar11[lVar1].num_blocks[0];
              lVar24 = (long)(int)uVar32 % lVar26;
              _index[0] = (int)lVar24;
              if (1 < (short)uVar3) {
                lVar30 = 0;
                uVar17 = uVar32;
                do {
                  uVar17 = (long)((int)uVar17 - (int)lVar24) / lVar26;
                  lVar26 = pgVar11[g_a + 1000].num_blocks[lVar30 + 1];
                  lVar24 = (long)(int)uVar17 % lVar26;
                  _index[lVar30 + 1] = (int)lVar24;
                  lVar30 = lVar30 + 1;
                } while ((uVar31 & 0xffffffff) - 1 != lVar30);
              }
              if (0 < (short)uVar3) {
                lVar26 = 0;
                do {
                  iVar18 = *(int *)((long)_index + lVar26);
                  lVar24 = *(long *)((long)pgVar11[g_a + 1000].block_dims + lVar26 * 2);
                  *(long *)(err_string + lVar26 * 2) = lVar24 * iVar18 + 1;
                  lVar24 = ((long)iVar18 + 1) * lVar24;
                  lVar30 = *(long *)((long)pgVar11[g_a + 1000].dims + lVar26 * 2);
                  if (lVar30 <= lVar24) {
                    lVar24 = lVar30;
                  }
                  *(long *)((long)_hi + lVar26 * 2) = lVar24;
                  lVar26 = lVar26 + 4;
                } while ((uVar31 & 0xffffffff) << 2 != lVar26);
              }
            }
            else if (iVar18 == 4) {
              lVar26 = pgVar11[lVar1].num_blocks[0];
              lVar24 = (long)(int)uVar32 % lVar26;
              _index[0] = (int)lVar24;
              if (1 < (short)uVar3) {
                lVar30 = 0;
                uVar17 = uVar32;
                do {
                  uVar17 = (long)((int)uVar17 - (int)lVar24) / lVar26;
                  lVar26 = pgVar11[g_a + 1000].num_blocks[lVar30 + 1];
                  lVar24 = (long)(int)uVar17 % lVar26;
                  _index[lVar30 + 1] = (int)lVar24;
                  lVar30 = lVar30 + 1;
                } while ((uVar31 & 0xffffffff) - 1 != lVar30);
              }
              if (0 < (short)uVar3) {
                pCVar10 = pgVar11[lVar1].mapc;
                lVar26 = 0;
                iVar18 = 0;
                do {
                  iVar12 = *(int *)((long)_index + lVar26);
                  lVar30 = (long)iVar18 + (long)iVar12;
                  *(C_Integer *)(err_string + lVar26 * 2) = pCVar10[lVar30];
                  lVar24 = *(long *)((long)pgVar11[lVar1].num_blocks + lVar26 * 2);
                  if ((long)iVar12 < lVar24 + -1) {
                    lVar30 = pCVar10[lVar30 + 1] + -1;
                  }
                  else {
                    lVar30 = *(long *)((long)pgVar11[lVar1].dims + lVar26 * 2);
                  }
                  *(long *)((long)_hi + lVar26 * 2) = lVar30;
                  iVar18 = iVar18 + (int)lVar24;
                  lVar26 = lVar26 + 4;
                } while ((uVar31 & 0xffffffff) << 2 != lVar26);
              }
            }
            else if (iVar18 == 0) {
              if (pgVar11[lVar1].num_rstrctd == 0) {
                if (0 < (short)uVar3) {
                  lVar26 = 1;
                  uVar17 = 0;
                  do {
                    lVar26 = lVar26 * pgVar11[g_a + 1000].nblock[uVar17];
                    uVar17 = uVar17 + 1;
                  } while (uVar31 != uVar17);
                  if (((long)uVar32 < 0) || (lVar26 <= (long)uVar32)) {
LAB_0018a4b5:
                    uVar17 = uVar31;
                    if (0 < (short)uVar3) goto LAB_0018a4c2;
                  }
                  else if (0 < (short)uVar3) {
                    pCVar10 = pgVar11[lVar1].mapc;
                    lVar26 = 0;
                    uVar28 = 0;
                    uVar17 = uVar32;
                    do {
                      lVar30 = (long)pgVar11[g_a + 1000].nblock[uVar28];
                      lVar24 = (long)uVar17 % lVar30;
                      plo_loc[uVar28 - 0x20] = pCVar10[lVar24 + lVar26];
                      if (lVar24 == lVar30 + -1) {
                        CVar25 = pgVar11[g_a + 1000].dims[uVar28];
                      }
                      else {
                        CVar25 = pCVar10[lVar24 + lVar26 + 1] + -1;
                      }
                      lVar26 = lVar26 + lVar30;
                      _hi[uVar28] = CVar25;
                      uVar28 = uVar28 + 1;
                      uVar17 = (long)uVar17 / lVar30;
                    } while (uVar31 != uVar28);
                  }
                }
              }
              else if ((long)uVar32 < pgVar11[lVar1].num_rstrctd) {
                if (0 < (short)uVar3) {
                  lVar26 = 1;
                  uVar17 = 0;
                  do {
                    lVar26 = lVar26 * pgVar11[g_a + 1000].nblock[uVar17];
                    uVar17 = uVar17 + 1;
                  } while (uVar31 != uVar17);
                  if (((long)uVar32 < 0) || (lVar26 <= (long)uVar32)) goto LAB_0018a4b5;
                  if (0 < (short)uVar3) {
                    pCVar10 = pgVar11[lVar1].mapc;
                    lVar26 = 0;
                    uVar28 = 0;
                    uVar17 = uVar32;
                    do {
                      lVar30 = (long)pgVar11[g_a + 1000].nblock[uVar28];
                      lVar24 = (long)uVar17 % lVar30;
                      plo_loc[uVar28 - 0x20] = pCVar10[lVar24 + lVar26];
                      if (lVar24 == lVar30 + -1) {
                        CVar25 = pgVar11[g_a + 1000].dims[uVar28];
                      }
                      else {
                        CVar25 = pCVar10[lVar24 + lVar26 + 1] + -1;
                      }
                      lVar26 = lVar26 + lVar30;
                      _hi[uVar28] = CVar25;
                      uVar28 = uVar28 + 1;
                      uVar17 = (long)uVar17 / lVar30;
                    } while (uVar31 != uVar28);
                  }
                }
              }
              else if (0 < (short)uVar3) {
                uVar17 = (ulong)uVar3;
LAB_0018a4c2:
                memset(err_string,0,uVar17 << 3);
                memset(_hi,0xff,uVar17 << 3);
              }
            }
            if (uVar31 == 1) {
              ld_rem[0] = (_hi[0] - err_string._0_8_) + pgVar11[lVar1].width[0] * 2 + 1;
            }
            if ((short)uVar3 < 2) {
              lVar24 = 1;
              lVar26 = 0;
            }
            else {
              lVar24 = 1;
              lVar30 = 0;
              lVar26 = 0;
              do {
                lVar26 = lVar26 + plo_rem[lVar30] * lVar24;
                lVar27 = (_hi[lVar30] - plo_loc[lVar30 + -0x20]) +
                         pgVar11[g_a + 1000].width[lVar30] * 2 + 1;
                ld_rem[lVar30] = lVar27;
                lVar24 = lVar24 * lVar27;
                lVar30 = lVar30 + 1;
              } while (uVar31 - 1 != lVar30);
            }
            lVar30 = plo_rem[uVar31 - 1];
            pcVar9 = ppcVar7[uVar32];
            stride_loc[0] = iVar4;
            stride_rem[0] = iVar4;
            if (sVar2 != 1) {
              lVar27 = 0;
              iVar18 = iVar4;
              iVar12 = iVar4;
              do {
                iVar18 = iVar18 * (int)ld_rem[lVar27];
                stride_rem[lVar27] = iVar18;
                iVar12 = iVar12 * (int)ld_loc[lVar27];
                stride_loc[lVar27] = iVar12;
                stride_rem[lVar27 + 1] = iVar18;
                stride_loc[lVar27 + 1] = iVar12;
                lVar27 = lVar27 + 1;
              } while (lVar21 != lVar27);
            }
            lVar27 = 0;
            do {
              count[lVar27] = ((int)phi_rem[lVar27] - (int)plo_rem[lVar27]) + 1;
              lVar27 = lVar27 + 1;
            } while (ndim != lVar27);
            count[0] = count[0] * iVar4;
            if (-1 < iVar5) {
              uVar32 = (ulong)(uint)PGRP_LIST[grp_id].inv_map_proc_list[uVar32];
            }
            ARMCI_PutS(pcVar8 + (lVar23 * lVar29 + lVar33) * (long)iVar22,stride_loc,
                       pcVar9 + (lVar24 * lVar30 + lVar26) * (long)iVar22,stride_rem,count,
                       (int)lVar20,(int)uVar32);
            get_remote_block_pos(IVar34,ndim,lo_loc,hi_loc,slo_rem,shi_rem,dims,width);
            lVar13 = pnga_locate_region(g_a,slo_rem,shi_rem,map,(Integer *)proclist,&np);
            if (lVar13 == 0) {
              builtin_strncpy(err_string,"cannot locate region: ",0x17);
              strcpy(err_string + 0x16,GA[lVar1].name);
              sVar15 = strlen(err_string);
              sprintf(err_string + (int)sVar15," [%ld:%ld ",slo_rem[0],shi_rem[0]);
              sVar15 = strlen(err_string);
              iVar18 = (int)sVar15;
              IVar16 = pnga_ndim(g_a);
              if (1 < IVar16) {
                lVar33 = 1;
                do {
                  sprintf(err_string + (int)sVar15,",%ld:%ld ",slo_rem[lVar33],shi_rem[lVar33]);
                  sVar15 = strlen(err_string);
                  iVar18 = (int)sVar15;
                  lVar33 = lVar33 + 1;
                  IVar16 = pnga_ndim(g_a);
                } while (lVar33 < IVar16);
              }
              (err_string + iVar18)[0] = ']';
              (err_string + iVar18)[1] = '\0';
              pnga_error(err_string,g_a);
            }
            uVar32 = *proclist;
            pnga_distribution(g_a,uVar32,tlo_rem,thi_rem);
            pgVar11 = GA;
            lVar33 = 0;
            do {
              if (increment[lVar33] == 0) {
                if (IVar34 == lVar33) {
                  plo_rem[IVar34] = 0;
                  phi_rem[IVar34] = lVar6 + -1;
                  plo_loc[IVar34] = (hi_loc[IVar34] + lVar6 + -1) - lo_loc[IVar34];
                }
                else {
                  lVar23 = width[lVar33];
                  plo_rem[lVar33] = lVar23;
                  phi_rem[lVar33] = (thi_rem[lVar33] + lVar23) - tlo_rem[lVar33];
                  plo_loc[lVar33] = lVar23;
                }
              }
              else {
                plo_rem[lVar33] = 0;
                phi_rem[lVar33] = (increment[lVar33] + thi_rem[lVar33]) - tlo_rem[lVar33];
                plo_loc[lVar33] = 0;
              }
              lVar33 = lVar33 + 1;
            } while (ndim != lVar33);
            uVar3 = GA[lVar1].ndim;
            uVar31 = (ulong)(short)uVar3;
            iVar18 = GA[lVar1].distr_type;
            if (iVar18 - 1U < 3) {
              lVar33 = GA[lVar1].num_blocks[0];
              lVar23 = lVar14 % lVar33;
              _index[0] = (int)lVar23;
              if (1 < (short)uVar3) {
                lVar29 = 0;
                IVar16 = proc;
                do {
                  IVar16 = (long)((int)IVar16 - (int)lVar23) / lVar33;
                  lVar33 = GA[g_a + 1000].num_blocks[lVar29 + 1];
                  lVar23 = (long)(int)IVar16 % lVar33;
                  _index[lVar29 + 1] = (int)lVar23;
                  lVar29 = lVar29 + 1;
                } while ((uVar31 & 0xffffffff) - 1 != lVar29);
              }
              if (0 < (short)uVar3) {
                lVar33 = 0;
                do {
                  iVar22 = *(int *)((long)_index + lVar33);
                  lVar23 = *(long *)((long)GA[g_a + 1000].block_dims + lVar33 * 2);
                  *(long *)(err_string + lVar33 * 2) = lVar23 * iVar22 + 1;
                  lVar23 = ((long)iVar22 + 1) * lVar23;
                  lVar29 = *(long *)((long)GA[g_a + 1000].dims + lVar33 * 2);
                  if (lVar29 <= lVar23) {
                    lVar23 = lVar29;
                  }
                  *(long *)((long)_hi + lVar33 * 2) = lVar23;
                  lVar33 = lVar33 + 4;
                } while ((uVar31 & 0xffffffff) << 2 != lVar33);
              }
            }
            else if (iVar18 == 4) {
              lVar33 = GA[lVar1].num_blocks[0];
              lVar23 = lVar14 % lVar33;
              _index[0] = (int)lVar23;
              if (1 < (short)uVar3) {
                lVar29 = 0;
                IVar16 = proc;
                do {
                  IVar16 = (long)((int)IVar16 - (int)lVar23) / lVar33;
                  lVar33 = GA[g_a + 1000].num_blocks[lVar29 + 1];
                  lVar23 = (long)(int)IVar16 % lVar33;
                  _index[lVar29 + 1] = (int)lVar23;
                  lVar29 = lVar29 + 1;
                } while ((uVar31 & 0xffffffff) - 1 != lVar29);
              }
              if (0 < (short)uVar3) {
                pCVar10 = GA[lVar1].mapc;
                lVar33 = 0;
                iVar22 = 0;
                do {
                  iVar12 = *(int *)((long)_index + lVar33);
                  lVar29 = (long)iVar22 + (long)iVar12;
                  *(C_Integer *)(err_string + lVar33 * 2) = pCVar10[lVar29];
                  lVar23 = *(long *)((long)GA[lVar1].num_blocks + lVar33 * 2);
                  if ((long)iVar12 < lVar23 + -1) {
                    lVar29 = pCVar10[lVar29 + 1] + -1;
                  }
                  else {
                    lVar29 = *(long *)((long)GA[lVar1].dims + lVar33 * 2);
                  }
                  *(long *)((long)_hi + lVar33 * 2) = lVar29;
                  iVar22 = iVar22 + (int)lVar23;
                  lVar33 = lVar33 + 4;
                } while ((uVar31 & 0xffffffff) << 2 != lVar33);
              }
            }
            else if (iVar18 == 0) {
              if (GA[lVar1].num_rstrctd == 0) {
                if (0 < (short)uVar3) {
                  lVar33 = 1;
                  uVar17 = 0;
                  do {
                    lVar33 = lVar33 * GA[g_a + 1000].nblock[uVar17];
                    uVar17 = uVar17 + 1;
                  } while (uVar31 != uVar17);
                  if ((proc < 0) || (lVar33 <= proc)) goto LAB_0018ac64;
                  if (0 < (short)uVar3) {
                    pCVar10 = GA[lVar1].mapc;
                    lVar33 = 0;
                    uVar17 = 0;
                    IVar16 = proc;
                    do {
                      lVar29 = (long)GA[g_a + 1000].nblock[uVar17];
                      lVar23 = IVar16 % lVar29;
                      plo_loc[uVar17 - 0x20] = pCVar10[lVar23 + lVar33];
                      if (lVar23 == lVar29 + -1) {
                        CVar25 = GA[g_a + 1000].dims[uVar17];
                      }
                      else {
                        CVar25 = pCVar10[lVar23 + lVar33 + 1] + -1;
                      }
                      lVar33 = lVar33 + lVar29;
                      _hi[uVar17] = CVar25;
                      uVar17 = uVar17 + 1;
                      IVar16 = IVar16 / lVar29;
                    } while (uVar31 != uVar17);
                  }
                }
              }
              else if (proc < GA[lVar1].num_rstrctd) {
                if (0 < (short)uVar3) {
                  lVar33 = 1;
                  uVar17 = 0;
                  do {
                    lVar33 = lVar33 * GA[g_a + 1000].nblock[uVar17];
                    uVar17 = uVar17 + 1;
                  } while (uVar31 != uVar17);
                  if ((proc < 0) || (lVar33 <= proc)) goto LAB_0018ac64;
                  if (0 < (short)uVar3) {
                    pCVar10 = GA[lVar1].mapc;
                    lVar33 = 0;
                    uVar17 = 0;
                    IVar16 = proc;
                    do {
                      lVar29 = (long)GA[g_a + 1000].nblock[uVar17];
                      lVar23 = IVar16 % lVar29;
                      plo_loc[uVar17 - 0x20] = pCVar10[lVar23 + lVar33];
                      if (lVar23 == lVar29 + -1) {
                        CVar25 = GA[g_a + 1000].dims[uVar17];
                      }
                      else {
                        CVar25 = pCVar10[lVar23 + lVar33 + 1] + -1;
                      }
                      lVar33 = lVar33 + lVar29;
                      _hi[uVar17] = CVar25;
                      uVar17 = uVar17 + 1;
                      IVar16 = IVar16 / lVar29;
                    } while (uVar31 != uVar17);
                  }
                }
              }
              else {
LAB_0018ac64:
                if (0 < (short)uVar3) {
                  memset(err_string,0,uVar31 * 8);
                  memset(_hi,0xff,uVar31 * 8);
                }
              }
            }
            if (uVar31 == 1) {
              ld_loc[0] = (_hi[0] - err_string._0_8_) + pgVar11[lVar1].width[0] * 2 + 1;
            }
            if ((short)uVar3 < 2) {
              lVar23 = 1;
              lVar33 = 0;
            }
            else {
              lVar23 = 1;
              lVar33 = 0;
              lVar29 = 0;
              do {
                lVar33 = lVar33 + plo_loc[lVar29] * lVar23;
                lVar26 = (_hi[lVar29] - plo_loc[lVar29 + -0x20]) +
                         pgVar11[g_a + 1000].width[lVar29] * 2 + 1;
                ld_loc[lVar29] = lVar26;
                lVar23 = lVar23 * lVar26;
                lVar29 = lVar29 + 1;
              } while (uVar31 - 1 != lVar29);
            }
            lVar29 = plo_loc[uVar31 - 1];
            ppcVar7 = pgVar11[lVar1].ptr;
            iVar22 = pgVar11[lVar1].elemsize;
            pcVar8 = ppcVar7[proc];
            if (iVar18 - 1U < 3) {
              lVar26 = pgVar11[lVar1].num_blocks[0];
              lVar24 = (long)(int)uVar32 % lVar26;
              _index[0] = (int)lVar24;
              if (1 < (short)uVar3) {
                lVar30 = 0;
                uVar17 = uVar32;
                do {
                  uVar17 = (long)((int)uVar17 - (int)lVar24) / lVar26;
                  lVar26 = pgVar11[g_a + 1000].num_blocks[lVar30 + 1];
                  lVar24 = (long)(int)uVar17 % lVar26;
                  _index[lVar30 + 1] = (int)lVar24;
                  lVar30 = lVar30 + 1;
                } while ((uVar31 & 0xffffffff) - 1 != lVar30);
              }
              if (0 < (short)uVar3) {
                lVar26 = 0;
                do {
                  iVar18 = *(int *)((long)_index + lVar26);
                  lVar24 = *(long *)((long)pgVar11[g_a + 1000].block_dims + lVar26 * 2);
                  *(long *)(err_string + lVar26 * 2) = lVar24 * iVar18 + 1;
                  lVar24 = ((long)iVar18 + 1) * lVar24;
                  lVar30 = *(long *)((long)pgVar11[g_a + 1000].dims + lVar26 * 2);
                  if (lVar30 <= lVar24) {
                    lVar24 = lVar30;
                  }
                  *(long *)((long)_hi + lVar26 * 2) = lVar24;
                  lVar26 = lVar26 + 4;
                } while ((uVar31 & 0xffffffff) << 2 != lVar26);
              }
            }
            else if (iVar18 == 4) {
              lVar26 = pgVar11[lVar1].num_blocks[0];
              lVar24 = (long)(int)uVar32 % lVar26;
              _index[0] = (int)lVar24;
              if (1 < (short)uVar3) {
                lVar30 = 0;
                uVar17 = uVar32;
                do {
                  uVar17 = (long)((int)uVar17 - (int)lVar24) / lVar26;
                  lVar26 = pgVar11[g_a + 1000].num_blocks[lVar30 + 1];
                  lVar24 = (long)(int)uVar17 % lVar26;
                  _index[lVar30 + 1] = (int)lVar24;
                  lVar30 = lVar30 + 1;
                } while ((uVar31 & 0xffffffff) - 1 != lVar30);
              }
              if (0 < (short)uVar3) {
                pCVar10 = pgVar11[lVar1].mapc;
                lVar26 = 0;
                iVar18 = 0;
                do {
                  iVar12 = *(int *)((long)_index + lVar26);
                  lVar30 = (long)iVar18 + (long)iVar12;
                  *(C_Integer *)(err_string + lVar26 * 2) = pCVar10[lVar30];
                  lVar24 = *(long *)((long)pgVar11[lVar1].num_blocks + lVar26 * 2);
                  if ((long)iVar12 < lVar24 + -1) {
                    lVar30 = pCVar10[lVar30 + 1] + -1;
                  }
                  else {
                    lVar30 = *(long *)((long)pgVar11[lVar1].dims + lVar26 * 2);
                  }
                  *(long *)((long)_hi + lVar26 * 2) = lVar30;
                  iVar18 = iVar18 + (int)lVar24;
                  lVar26 = lVar26 + 4;
                } while ((uVar31 & 0xffffffff) << 2 != lVar26);
              }
            }
            else if (iVar18 == 0) {
              if (pgVar11[lVar1].num_rstrctd == 0) {
                if (0 < (short)uVar3) {
                  lVar26 = 1;
                  uVar17 = 0;
                  do {
                    lVar26 = lVar26 * pgVar11[g_a + 1000].nblock[uVar17];
                    uVar17 = uVar17 + 1;
                  } while (uVar31 != uVar17);
                  if (((long)uVar32 < 0) || (lVar26 <= (long)uVar32)) {
LAB_0018b080:
                    uVar17 = uVar31;
                    if (0 < (short)uVar3) goto LAB_0018b08d;
                  }
                  else if (0 < (short)uVar3) {
                    pCVar10 = pgVar11[lVar1].mapc;
                    lVar26 = 0;
                    uVar28 = 0;
                    uVar17 = uVar32;
                    do {
                      lVar30 = (long)pgVar11[g_a + 1000].nblock[uVar28];
                      lVar24 = (long)uVar17 % lVar30;
                      plo_loc[uVar28 - 0x20] = pCVar10[lVar24 + lVar26];
                      if (lVar24 == lVar30 + -1) {
                        CVar25 = pgVar11[g_a + 1000].dims[uVar28];
                      }
                      else {
                        CVar25 = pCVar10[lVar24 + lVar26 + 1] + -1;
                      }
                      lVar26 = lVar26 + lVar30;
                      _hi[uVar28] = CVar25;
                      uVar28 = uVar28 + 1;
                      uVar17 = (long)uVar17 / lVar30;
                    } while (uVar31 != uVar28);
                  }
                }
              }
              else if ((long)uVar32 < pgVar11[lVar1].num_rstrctd) {
                if (0 < (short)uVar3) {
                  lVar26 = 1;
                  uVar17 = 0;
                  do {
                    lVar26 = lVar26 * pgVar11[g_a + 1000].nblock[uVar17];
                    uVar17 = uVar17 + 1;
                  } while (uVar31 != uVar17);
                  if (((long)uVar32 < 0) || (lVar26 <= (long)uVar32)) goto LAB_0018b080;
                  if (0 < (short)uVar3) {
                    pCVar10 = pgVar11[lVar1].mapc;
                    lVar26 = 0;
                    uVar28 = 0;
                    uVar17 = uVar32;
                    do {
                      lVar30 = (long)pgVar11[g_a + 1000].nblock[uVar28];
                      lVar24 = (long)uVar17 % lVar30;
                      plo_loc[uVar28 - 0x20] = pCVar10[lVar24 + lVar26];
                      if (lVar24 == lVar30 + -1) {
                        CVar25 = pgVar11[g_a + 1000].dims[uVar28];
                      }
                      else {
                        CVar25 = pCVar10[lVar24 + lVar26 + 1] + -1;
                      }
                      lVar26 = lVar26 + lVar30;
                      _hi[uVar28] = CVar25;
                      uVar28 = uVar28 + 1;
                      uVar17 = (long)uVar17 / lVar30;
                    } while (uVar31 != uVar28);
                  }
                }
              }
              else if (0 < (short)uVar3) {
                uVar17 = (ulong)uVar3;
LAB_0018b08d:
                memset(err_string,0,uVar17 << 3);
                memset(_hi,0xff,uVar17 << 3);
              }
            }
            if (uVar31 == 1) {
              ld_rem[0] = (_hi[0] - err_string._0_8_) + pgVar11[lVar1].width[0] * 2 + 1;
            }
            if ((short)uVar3 < 2) {
              lVar24 = 1;
              lVar26 = 0;
            }
            else {
              lVar24 = 1;
              lVar26 = 0;
              lVar30 = 0;
              do {
                lVar26 = lVar26 + plo_rem[lVar30] * lVar24;
                lVar27 = (_hi[lVar30] - plo_loc[lVar30 + -0x20]) +
                         pgVar11[g_a + 1000].width[lVar30] * 2 + 1;
                ld_rem[lVar30] = lVar27;
                lVar24 = lVar24 * lVar27;
                lVar30 = lVar30 + 1;
              } while (uVar31 - 1 != lVar30);
            }
            lVar30 = plo_rem[uVar31 - 1];
            pcVar9 = ppcVar7[uVar32];
            stride_loc[0] = iVar4;
            stride_rem[0] = iVar4;
            if (sVar2 != 1) {
              lVar27 = 0;
              iVar18 = iVar4;
              iVar12 = iVar4;
              do {
                iVar18 = iVar18 * (int)ld_rem[lVar27];
                stride_rem[lVar27] = iVar18;
                iVar12 = iVar12 * (int)ld_loc[lVar27];
                stride_loc[lVar27] = iVar12;
                stride_rem[lVar27 + 1] = iVar18;
                stride_loc[lVar27 + 1] = iVar12;
                lVar27 = lVar27 + 1;
              } while (lVar21 != lVar27);
            }
            lVar27 = 0;
            do {
              count[lVar27] = ((int)phi_rem[lVar27] - (int)plo_rem[lVar27]) + 1;
              lVar27 = lVar27 + 1;
            } while (ndim != lVar27);
            count[0] = count[0] * iVar4;
            if (-1 < iVar5) {
              uVar32 = (ulong)(uint)PGRP_LIST[grp_id].inv_map_proc_list[uVar32];
            }
            ARMCI_PutS(pcVar8 + (lVar23 * lVar29 + lVar33) * (long)iVar22,stride_loc,
                       pcVar9 + (lVar24 * lVar30 + lVar26) * (long)iVar22,stride_rem,count,
                       (int)lVar20,(int)uVar32);
          }
          if (IVar34 < lVar20) {
            pnga_pgroup_sync(grp_id);
          }
          increment[IVar34] = lVar6 * 2;
          IVar34 = IVar34 + 1;
        } while (IVar34 != ndim);
      }
      free(map);
      free(proclist);
      lVar19 = 1;
    }
  }
  return lVar19;
}

Assistant:

logical pnga_update3_ghosts(Integer g_a)
{
  Integer idx, i, np, handle=GA_OFFSET + g_a, proc_rem;
  Integer size, ndim, nwidth, increment[MAXDIM];
  Integer width[MAXDIM];
  Integer dims[MAXDIM];
  Integer lo_loc[MAXDIM], hi_loc[MAXDIM];
  Integer plo_loc[MAXDIM]/*, phi_loc[MAXDIM]*/;
  Integer tlo_rem[MAXDIM], thi_rem[MAXDIM];
  Integer slo_rem[MAXDIM], shi_rem[MAXDIM];
  Integer plo_rem[MAXDIM], phi_rem[MAXDIM];
  Integer ld_loc[MAXDIM], ld_rem[MAXDIM];
  int stride_loc[MAXDIM], stride_rem[MAXDIM],count[MAXDIM];
  char *ptr_loc, *ptr_rem;
  Integer me = pnga_nodeid();
  Integer p_handle;
  Integer *_ga_map = NULL;
  Integer *_ga_proclist = NULL;

  /* This routine makes use of the shift algorithm to update data in the
   * ghost cells bounding the local block of visible data. The shift
   * algorithm starts by updating the blocks of data along the first
   * dimension by grabbing a block of data that is width[0] deep but
   * otherwise matches the  dimensions of the data residing on the
   * calling processor. The update of the second dimension, however,
   * grabs a block that is width[1] deep in the second dimension but is
   * ldim0 + 2*width[0] in the first dimensions where ldim0 is the
   * size of the visible data along the first dimension. The remaining
   * dimensions are left the same. For the next update, the width of the
   * second dimension is also increased by 2*width[1] and so on. This
   * algorith makes use of the fact that data for the dimensions that
   * have already been updated is available on each processor and can be
   * used in the updates of subsequent dimensions. The total number of
   * separate updates is 2*ndim, an update in the negative and positive
   * directions for each dimension. This implementation uses simple put
   * operations to perform the updates along each dimension with an
   * intervening synchronization call being used to make sure that the
   * necessary data is available on each processor before starting the
   * update along the next dimension.
   *
   * To perform the update, this routine makes use of several copies of
   * indices marking the upper and lower limits of data. Indices
   * beginning with the character "p" are relative indices marking the
   * location of the data set relative to the origin the local patch of
   * the global array, all other indices are in absolute coordinates and
   * mark locations in the total global array. The indices used by this
   * routine are described below.
   *
   *       lo_loc[], hi_loc[]: The lower and upper indices of the visible
   *       block of data held by the calling processor.
   *
   *       lo_rem[], hi_rem[]: The lower and upper indices of the block
   *       of data on a remote processor or processors that is needed to
   *       fill in the calling processors ghost cells. These indices are
   *       NOT corrected for wrap-around (periodic) boundary conditions
   *       so they can be negative or greater than the array dimension
   *       values held in dims[].
   *
   *       slo_rem[], shi_rem[]: Similar to lo_rem[] and hi_rem[], except
   *       that these indices have been corrected for wrap-around
   *       boundary conditions. 
   *
   *       thi_rem[], thi_rem[]: The lower and upper indices of the visible
   *       data on a remote processor.
   *
   *       plo_loc[], phi_loc[]: The indices of the local data patch that
   *       is going to be updated.
   *
   *       plo_rem[], phi_rem[]: The indices of the data patch on the
   *       remote processor that will be used to update the data on the
   *       calling processor. Note that the dimensions of the patches
   *       represented by plo_loc[], plo_rem[] and plo_loc[], phi_loc[]
   *       must be the same.
   */

  /* if global array has no ghost cells, just return */
  if (!pnga_has_ghosts(g_a)) return TRUE;

  size = GA[handle].elemsize;
  ndim = GA[handle].ndim;
  p_handle = GA[handle].p_handle;

  /* obtain range of data that is held by local processor */
  pnga_distribution(g_a,me,lo_loc,hi_loc);

  /* initialize range increments and get array dimensions */
  for (idx=0; idx < ndim; idx++) {
    increment[idx] = 0;
    width[idx] = (Integer)GA[handle].width[idx];
    dims[idx] = (Integer)GA[handle].dims[idx];
    if (lo_loc[idx] == 0 && hi_loc[idx] == -1) return FALSE;
  }

  /* Check to make sure that global array is well-behaved (all processors
     have data and the width of the data in each dimension is greater
     than the corresponding value in width[]. */
  if (!gai_check_ghost_distr(g_a)) return FALSE;

  _ga_map = malloc((GAnproc*2*MAXDIM+1)*sizeof(Integer));
  if(!_ga_map) pnga_error("pnga_update3_ghosts:malloc failed (_ga_map)",0);
  _ga_proclist = malloc(GAnproc*sizeof(Integer));
  if(!_ga_proclist) pnga_error("pnga_update3_ghosts:malloc failed (_ga_proclist)",0);

  /* Get pointer to local memory */
  ptr_loc = GA[handle].ptr[me];

  /* loop over dimensions for sequential update using shift algorithm */
  for (idx=0; idx < ndim; idx++) {
    nwidth = width[idx];

    /* Do not bother with update if nwidth is zero */
    if (nwidth != 0) {

      /* Perform update in negative direction. */
      get_remote_block_neg(idx, ndim, lo_loc, hi_loc, slo_rem, shi_rem,
                           dims, width);
      /* locate processor with this data */
      if (!pnga_locate_region(g_a, slo_rem, shi_rem, _ga_map,
          _ga_proclist, &np)) ga_RegionError(pnga_ndim(g_a),
          slo_rem, shi_rem, g_a);

      /* Get actual coordinates of desired location of remote
         data as well as the actual coordinates of the local chunk
         of data that will be sent to remote processor (these
         coordinates take into account the presence of ghost
         cells). Start by finding out what data is actually held by
         remote processor. */
      proc_rem = _ga_proclist[0];
      pnga_distribution(g_a, proc_rem, tlo_rem, thi_rem);
      for (i = 0; i < ndim; i++) {
        if (increment[i] == 0) {
          if (i == idx) {
            plo_rem[i] = thi_rem[i] - tlo_rem[i] + width[i] + 1;
            phi_rem[i] = thi_rem[i] - tlo_rem[i] + 2*width[i];
            plo_loc[i] = width[i];
            /*phi_loc[i] = 2*width[i] - 1;*/
          } else {
            plo_rem[i] = width[i];
            phi_rem[i] = thi_rem[i] - tlo_rem[i] + width[i];
            plo_loc[i] = width[i];
            /*phi_loc[i] = hi_loc[i] - lo_loc[i] + width[i];*/
          }
        } else {
          plo_rem[i] = 0;
          phi_rem[i] = thi_rem[i] - tlo_rem[i] + increment[i];
          plo_loc[i] = 0;
          /*phi_loc[i] = hi_loc[i] - lo_loc[i] + increment[i];*/
        }
      }

      /* Get pointer to local data buffer and remote data
         buffer as well as lists of leading dimenstions */
      gam_LocationWithGhosts(me, handle, plo_loc, &ptr_loc, ld_loc);
      gam_LocationWithGhosts(proc_rem, handle, plo_rem, &ptr_rem, ld_rem);

      /* Evaluate strides on local and remote processors */
      gam_setstride(ndim, size, ld_loc, ld_rem, stride_rem,
          stride_loc);

      /* Compute the number of elements in each dimension and store
         result in count. Scale the first element in count by the
         element size. */
      gam_ComputeCount(ndim, plo_rem, phi_rem, count);
      count[0] *= size;

      /* Put local data on remote processor */
      if (p_handle >= 0) {
        proc_rem = PGRP_LIST[p_handle].inv_map_proc_list[proc_rem];
      }
      ARMCI_PutS(ptr_loc, stride_loc, ptr_rem, stride_rem, count,
          (int)(ndim - 1), (int)proc_rem);

      /* Perform update in positive direction */
      get_remote_block_pos(idx, ndim, lo_loc, hi_loc, slo_rem, shi_rem,
                           dims, width);
      /* locate processor with this data */
      if (!pnga_locate_region(g_a, slo_rem, shi_rem, _ga_map,
          _ga_proclist, &np)) ga_RegionError(pnga_ndim(g_a),
          slo_rem, shi_rem, g_a);

      /* Get actual coordinates of desired chunk of remote
         data as well as the actual coordinates of the local chunk
         of data that will receive the remote data (these
         coordinates take into account the presence of ghost
         cells). Start by finding out what data is actually held by
         remote processor. */
      proc_rem = _ga_proclist[0];
      pnga_distribution(g_a, proc_rem, tlo_rem, thi_rem);
      for (i = 0; i < ndim; i++) {
        if (increment[i] == 0) {
          if (i == idx) {
            plo_rem[i] = 0;
            phi_rem[i] = width[i] - 1;
            plo_loc[i] = hi_loc[i] - lo_loc[i] + width[i] - 1;
            /*phi_loc[i] = hi_loc[i] - lo_loc[i] + 2*width[i] - 1;*/
          } else {
            plo_rem[i] = width[i];
            phi_rem[i] = thi_rem[i] - tlo_rem[i] + width[i];
            plo_loc[i] = width[i];
            /*phi_loc[i] = hi_loc[i] - lo_loc[i] + width[i];*/
          }
        } else {
          plo_rem[i] = 0;
          phi_rem[i] = thi_rem[i] - tlo_rem[i] + increment[i];
          plo_loc[i] = 0;
          /*phi_loc[i] = hi_loc[i] - lo_loc[i] + increment[i];*/
        }
      }

      /* Get pointer to local data buffer and remote data
         buffer as well as lists of leading dimenstions */
      gam_LocationWithGhosts(me, handle, plo_loc, &ptr_loc, ld_loc);
      gam_LocationWithGhosts(proc_rem, handle, plo_rem, &ptr_rem, ld_rem);

      /* Evaluate strides on local and remote processors */
      gam_setstride(ndim, size, ld_loc, ld_rem, stride_rem,
          stride_loc);

      /* Compute the number of elements in each dimension and store
         result in count. Scale the first element in count by the
         element size. */
      gam_ComputeCount(ndim, plo_rem, phi_rem, count);
      count[0] *= size;

      /* get remote data */
      if (p_handle >= 0) {
        proc_rem = PGRP_LIST[p_handle].inv_map_proc_list[proc_rem];
      }
      ARMCI_PutS(ptr_loc, stride_loc, ptr_rem, stride_rem, count,
          (int)(ndim - 1), (int)proc_rem);
    }
    /* synchronize all processors and update increment array */
    if (idx < ndim-1) pnga_pgroup_sync(p_handle);
    increment[idx] = 2*nwidth;
  }
  free(_ga_map);
  free(_ga_proclist);
  return TRUE;
}